

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

void __thiscall ninx::lexer::token::Text::Text(Text *this,int line_number,string *text)

{
  bool bVar1;
  int iVar2;
  string *text_local;
  int line_number_local;
  Text *this_local;
  
  Token::Token(&this->super_Token,line_number);
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Text_001c60f8;
  std::__cxx11::string::string((string *)&this->text,(string *)text);
  this->valid_newline = false;
  if ((Text(int,std::__cxx11::string_const&)::multiple_newline_validation == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Text(int,std::__cxx11::string_const&)::
                                   multiple_newline_validation), iVar2 != 0)) {
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    basic_regex(&Text::multiple_newline_validation,"\\s*[\\n]{2,}\\s*",0);
    __cxa_atexit(boost::
                 basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                 ~basic_regex,&Text::multiple_newline_validation,&__dso_handle);
    __cxa_guard_release(&Text(int,std::__cxx11::string_const&)::multiple_newline_validation);
  }
  bVar1 = boost::
          regex_match<std::char_traits<char>,std::allocator<char>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                    (&this->text,&Text::multiple_newline_validation,format_default);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&this->text,"\n");
    this->valid_newline = true;
  }
  return;
}

Assistant:

ninx::lexer::token::Text::Text(int line_number, const std::string &text) : Token(line_number), text(text) {
    // Check if there are multiple spaces
    static const boost::regex multiple_newline_validation("\\s*[\\n]{2,}\\s*");
    if (regex_match(this->text, multiple_newline_validation)) {
        this->text = "\n";
        valid_newline = true;
    }
}